

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function2.hpp
# Opt level: O1

void fu2::abi_400::detail::type_erasure::tables::
     vtable<fu2::abi_400::detail::property<true,_false,_void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>
     ::empty_cmd(vtable<fu2::abi_400::detail::property<true,_false,_void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_>
                 *to_table,opcode op,data_accessor *param_3,size_t param_4,data_accessor *to,
                size_t param_6)

{
  if (op < op_destroy) {
    to_table->vtable_ =
         invocation_table::
         function_trait<void_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>::
         empty_invoker<true>::invoke;
    to_table->cmd_ = empty_cmd;
    return;
  }
  if (op - op_destroy < 2) {
    return;
  }
  to->inplace_storage_ = 1;
  return;
}

Assistant:

static void empty_cmd(vtable* to_table, opcode op, data_accessor* /*from*/,
                        std::size_t /*from_capacity*/, data_accessor* to,
                        std::size_t /*to_capacity*/) {

    switch (op) {
      case opcode::op_move:
      case opcode::op_copy: {
        to_table->set_empty();
        break;
      }
      case opcode::op_destroy:
      case opcode::op_weak_destroy: {
        // Do nothing
        break;
      }
      case opcode::op_fetch_empty: {
        write_empty(to, true);
        break;
      }
      default: {
        FU2_DETAIL_UNREACHABLE();
      }
    }
  }